

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

int smf::MidiEventList::eventCompareNoteOffsBeforeOns(void *a,void *b)

{
  MidiMessage *this;
  MidiMessage *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  this = *a;
  this_00 = *b;
  iVar2 = *(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar3 = *(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (iVar3 < iVar2) {
    return -1;
  }
  if (iVar3 <= iVar2) {
    iVar2 = *(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    if (iVar2 != 0) {
      iVar3 = *(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      if (iVar3 != 0 && iVar2 < iVar3) {
        return -1;
      }
      if (iVar3 != 0 && iVar3 < iVar2) {
        return 1;
      }
    }
    iVar2 = MidiMessage::getP0(this);
    if ((iVar2 != 0xff) || (iVar2 = MidiMessage::getP1(this), iVar2 != 0x2f)) {
      iVar2 = MidiMessage::getP0(this_00);
      if ((iVar2 == 0xff) && (iVar2 = MidiMessage::getP1(this_00), iVar2 == 0x2f)) {
        return -1;
      }
      iVar2 = MidiMessage::getP0(this);
      if ((iVar2 == 0xff) && (iVar2 = MidiMessage::getP0(this_00), iVar2 != 0xff)) {
        return -1;
      }
      iVar2 = MidiMessage::getP0(this);
      if ((iVar2 == 0xff) || (iVar2 = MidiMessage::getP0(this_00), iVar2 != 0xff)) {
        iVar2 = MidiMessage::getP0(this);
        if ((iVar2 == 0xff) && (iVar2 = MidiMessage::getP0(this_00), iVar2 == 0xff)) {
          return 0;
        }
        bVar1 = MidiMessage::isNote(this);
        if ((!bVar1) || (bVar1 = MidiMessage::isNote(this_00), bVar1)) {
          bVar1 = MidiMessage::isNote(this);
          if ((!bVar1) && (bVar1 = MidiMessage::isNote(this_00), bVar1)) {
            return -1;
          }
          bVar1 = MidiMessage::isNoteOff(this);
          if ((bVar1) && (bVar1 = MidiMessage::isNoteOn(this_00), bVar1)) {
            return -1;
          }
          bVar1 = MidiMessage::isNoteOn(this);
          if ((!bVar1) || (bVar1 = MidiMessage::isNoteOff(this_00), !bVar1)) {
            bVar1 = MidiMessage::isNoteOn(this);
            if (((bVar1) && (bVar1 = MidiMessage::isNoteOn(this_00), bVar1)) ||
               ((bVar1 = MidiMessage::isNoteOff(this), bVar1 &&
                (bVar1 = MidiMessage::isNoteOff(this_00), bVar1)))) {
              iVar2 = MidiMessage::getP1(this);
              iVar3 = MidiMessage::getP1(this_00);
              if (iVar3 <= iVar2) {
                iVar2 = MidiMessage::getP1(this);
                iVar3 = MidiMessage::getP1(this_00);
                return (uint)(iVar3 < iVar2);
              }
              return -1;
            }
            uVar4 = MidiMessage::getP0(this);
            if ((uVar4 & 0xf0) != 0xb0) {
              return 0;
            }
            uVar4 = MidiMessage::getP0(this_00);
            if ((uVar4 & 0xf0) != 0xb0) {
              return 0;
            }
            iVar2 = MidiMessage::getP1(this);
            iVar3 = MidiMessage::getP1(this_00);
            if (iVar2 <= iVar3) {
              iVar2 = MidiMessage::getP1(this);
              iVar3 = MidiMessage::getP1(this_00);
              if (iVar2 < iVar3) {
                return -1;
              }
              iVar2 = MidiMessage::getP2(this);
              iVar3 = MidiMessage::getP2(this_00);
              if (iVar2 <= iVar3) {
                iVar2 = MidiMessage::getP2(this);
                iVar3 = MidiMessage::getP2(this_00);
                return -(uint)(iVar2 < iVar3);
              }
              return 1;
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int MidiEventList::eventCompareNoteOffsBeforeOns(const void* a, const void* b) {
	MidiEvent& aevent = **((MidiEvent**)a);
	MidiEvent& bevent = **((MidiEvent**)b);

	if (aevent.tick < bevent.tick) {
		// aevent occurs before bevent
		return -1;
	} else if (aevent.tick > bevent.tick) {
		// aevent occurs after bevent
		return +1;
	} else if ((aevent.seq != 0) && (bevent.seq != 0) && (aevent.seq < bevent.seq)) {
		// aevent sequencing state occurs before bevent
		// see MidiEventList::markSequence()
		return -1;
	} else if ((aevent.seq != 0) && (bevent.seq != 0) && (aevent.seq > bevent.seq)) {
		// aevent sequencing state occurs after bevent
		// see MidiEventList::markSequence()
		return +1;
	} else if ((aevent.getP0() == 0xff) && (aevent.getP1() == 0x2f)) {
		// end-of-track meta-message should always be last (but this won't really
		// matter since the writing function ignores all end-of-track messages
		// and writes its own.
		return +1;
	} else if ((bevent.getP0() == 0xff) && (bevent.getP1() == 0x2f)) {
		// end-of-track meta-message should always be last (but won't really
		// matter since the writing function ignores all end-of-track messages
		// and writes its own.
		return -1;
	} else if (aevent.getP0() == 0xff && bevent.getP0() != 0xff) {
		// other meta-messages are placed before real MIDI messages
		return -1;
	} else if ((aevent.getP0() != 0xff) && (bevent.getP0() == 0xff)) {
		// other meta-messages are placed before real MIDI messages
		return +1;
	} else if ((aevent.getP0() == 0xff) && (bevent.getP0() == 0xff)) {
		// could sort by meta-message number here
		return 0;
	} else if (aevent.isNote() && !bevent.isNote()) {
		// notes come after all other message types
		return +1;
	} else if (!aevent.isNote() && bevent.isNote()) {
		// notes come after all other message types
		return -1;
	} else if (aevent.isNoteOff() && bevent.isNoteOn()) {
		// note-offs come before note-ons
		return -1;
	} else if (aevent.isNoteOn() && bevent.isNoteOff()) {
		// note-ons come after all other types of MIDI messages
		return +1;
	} else if (aevent.isNoteOn() && bevent.isNoteOn()) {
		// sorted further by key number
		if (aevent.getP1() < bevent.getP1()) {
			return -1;
		} else if (aevent.getP1() > bevent.getP1()) {
			return +1;
		} else {
			return 0;
		}
		return 0;
	} else if (aevent.isNoteOff() && bevent.isNoteOff()) {
		// sorted further by key number
		if (aevent.getP1() < bevent.getP1()) {
			return -1;
		} else if (aevent.getP1() > bevent.getP1()) {
			return +1;
		} else {
			return 0;
		}
		// could be sorted further by key number.
		return 0;
	} else if (((aevent.getP0() & 0xf0) == 0xb0) && ((bevent.getP0() & 0xf0) == 0xb0)) {
		// both events are continuous controllers.  Sort them by controller number and value if equal
		if (aevent.getP1() > bevent.getP1()) {
			return +1;
		} if (aevent.getP1() < bevent.getP1()) {
			return -1;
		} else {
			// same controller number, so sort by data value
			// useful for sustain pedalling, for example.
			if (aevent.getP2() > bevent.getP2()) {
				return +1;
			} if (aevent.getP2() < bevent.getP2()) {
				return -1;
			} else {
				return 0;
			}
		}
	} else {
		return 0;
	}
}